

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

IdMap * __thiscall
libcellml::Validator::ValidatorImpl::buildModelIdMap_abi_cxx11_
          (IdMap *__return_storage_ptr__,ValidatorImpl *this,ModelPtr *model)

{
  _Rb_tree_header *p_Var1;
  size_type *psVar2;
  IssueImpl *this_00;
  bool bVar3;
  long *plVar4;
  size_t sVar5;
  undefined8 *puVar6;
  Entity *pEVar7;
  ulong *puVar8;
  long *plVar9;
  ulong *puVar10;
  element_type *peVar11;
  ulong uVar12;
  undefined8 uVar13;
  ValidatorImpl *pVVar14;
  ValidatorImpl *this_01;
  string reference;
  string prefix;
  string id;
  UnitsPtr units;
  IssuePtr issue;
  string info;
  double multiplier;
  double exponent;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reportedConnections;
  undefined1 local_210 [32];
  string local_1f0;
  string local_1d0;
  Validator *local_1b0;
  string local_1a8;
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  string local_168;
  IdMap *local_148;
  Model local_140;
  undefined1 local_120 [16];
  undefined1 local_110 [17];
  undefined7 uStack_ff;
  string local_f0;
  ulong local_d0;
  ValidatorImpl *local_c8;
  Entity *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  undefined1 local_b0 [32];
  string local_90;
  double local_70;
  double local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110._0_8_ = local_110 + 0x10;
  local_110._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_110[0x10] = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1b0 = (Validator *)model;
  local_148 = __return_storage_ptr__;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  Entity::id_abi_cxx11_
            ((string *)local_210,
             (Entity *)
             (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar13 = local_210._8_8_;
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  puVar10 = (ulong *)(local_210 + 0x10);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar13 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    NamedEntity::name_abi_cxx11_
              (&local_1d0,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
               &local_1b0->super_Logger)->_M_ptr);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x2b728e);
    pEVar7 = (Entity *)(plVar4 + 2);
    if ((Entity *)*plVar4 == pEVar7) {
      local_1f0.field_2._M_allocated_capacity = (size_type)pEVar7->_vptr_Entity;
      local_1f0.field_2._8_8_ = plVar4[3];
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    }
    else {
      local_1f0.field_2._M_allocated_capacity = (size_type)pEVar7->_vptr_Entity;
      local_1f0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1f0._M_string_length = plVar4[1];
    *plVar4 = (long)pEVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_210._16_8_ = *puVar8;
      local_210._24_8_ = plVar4[3];
      local_210._0_8_ = puVar10;
    }
    else {
      local_210._16_8_ = *puVar8;
      local_210._0_8_ = (ulong *)*plVar4;
    }
    local_210._8_8_ = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)(local_120 + 0x10),(string *)local_210);
    if ((ulong *)local_210._0_8_ != puVar10) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    pVVar14 = (ValidatorImpl *)local_210;
    Entity::id_abi_cxx11_
              ((string *)pVVar14,
               (Entity *)
               ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
               &local_1b0->super_Logger)->_M_ptr);
    addIdMapItem(pVVar14,(string *)local_210,(string *)(local_120 + 0x10),local_148);
    if ((ulong *)local_210._0_8_ != puVar10) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
  }
  local_d0 = 0;
  local_c8 = this;
  while (sVar5 = Model::unitsCount(((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                                   &local_1b0->super_Logger)->_M_ptr), local_d0 < sVar5) {
    Model::units(&local_140,
                 (size_t)((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                         &local_1b0->super_Logger)->_M_ptr);
    Entity::id_abi_cxx11_
              ((string *)local_210,
               (Entity *)
               local_140.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
               _vptr_Entity);
    uVar13 = local_210._8_8_;
    if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar13 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar3 = ImportedEntity::isImport
                        ((ImportedEntity *)
                         ((long)local_140.super_ComponentEntity.super_NamedEntity.
                                super_ParentedEntity.super_Entity._vptr_Entity + 0x10));
      if (bVar3) {
        NamedEntity::name_abi_cxx11_
                  (&local_168,
                   (NamedEntity *)
                   local_140.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                   super_Entity._vptr_Entity);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x2b7299);
        local_188 = &local_178;
        plVar9 = plVar4 + 2;
        if ((long *)*plVar4 == plVar9) {
          local_178 = *plVar9;
          lStack_170 = plVar4[3];
        }
        else {
          local_178 = *plVar9;
          local_188 = (long *)*plVar4;
        }
        local_180 = plVar4[1];
        *plVar4 = (long)plVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_188);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        puVar10 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_1d0.field_2._M_allocated_capacity = *puVar10;
          local_1d0.field_2._8_8_ = plVar4[3];
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *puVar10;
          local_1d0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_1d0._M_string_length = plVar4[1];
        *plVar4 = (long)puVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        NamedEntity::name_abi_cxx11_
                  (&local_1a8,
                   (NamedEntity *)
                   ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_1b0->super_Logger)->_M_ptr);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          uVar13 = local_1d0.field_2._M_allocated_capacity;
        }
        uVar12 = (long)&((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2> *)
                        local_1d0._M_string_length)->_M_ptr + local_1a8._M_string_length;
        if ((ulong)uVar13 < uVar12) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            uVar13 = local_1a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < uVar12) goto LAB_00288faf;
          plVar4 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_1a8,0,(char *)0x0,
                                      (ulong)local_1d0._M_dataplus._M_p);
        }
        else {
LAB_00288faf:
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1d0,(ulong)local_1a8._M_dataplus._M_p);
        }
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        pEVar7 = (Entity *)(plVar4 + 2);
        if ((Entity *)*plVar4 == pEVar7) {
          local_1f0.field_2._M_allocated_capacity = (size_type)pEVar7->_vptr_Entity;
          local_1f0.field_2._8_8_ = plVar4[3];
        }
        else {
          local_1f0.field_2._M_allocated_capacity = (size_type)pEVar7->_vptr_Entity;
          local_1f0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_1f0._M_string_length = plVar4[1];
        *plVar4 = (long)pEVar7;
        plVar4[1] = 0;
        *(undefined1 *)&pEVar7->_vptr_Entity = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f0);
      }
      else {
        NamedEntity::name_abi_cxx11_
                  (&local_168,
                   (NamedEntity *)
                   local_140.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                   super_Entity._vptr_Entity);
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x2b72ba);
        local_188 = &local_178;
        plVar4 = puVar6 + 2;
        if ((long *)*puVar6 == plVar4) {
          local_178 = *plVar4;
          lStack_170 = puVar6[3];
        }
        else {
          local_178 = *plVar4;
          local_188 = (long *)*puVar6;
        }
        local_180 = puVar6[1];
        *puVar6 = plVar4;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        puVar10 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_1d0.field_2._M_allocated_capacity = *puVar10;
          local_1d0.field_2._8_8_ = puVar6[3];
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *puVar10;
          local_1d0._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_1d0._M_string_length = puVar6[1];
        *puVar6 = puVar10;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        NamedEntity::name_abi_cxx11_
                  (&local_1a8,
                   (NamedEntity *)
                   ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_1b0->super_Logger)->_M_ptr);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          uVar13 = local_1d0.field_2._M_allocated_capacity;
        }
        uVar12 = (long)&((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2> *)
                        local_1d0._M_string_length)->_M_ptr + local_1a8._M_string_length;
        if ((ulong)uVar13 < uVar12) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            uVar13 = local_1a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < uVar12) goto LAB_0028903e;
          plVar4 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_1a8,0,(char *)0x0,
                                      (ulong)local_1d0._M_dataplus._M_p);
        }
        else {
LAB_0028903e:
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_1d0,(ulong)local_1a8._M_dataplus._M_p);
        }
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        pEVar7 = (Entity *)(plVar4 + 2);
        if ((Entity *)*plVar4 == pEVar7) {
          local_1f0.field_2._M_allocated_capacity = (size_type)pEVar7->_vptr_Entity;
          local_1f0.field_2._8_8_ = plVar4[3];
        }
        else {
          local_1f0.field_2._M_allocated_capacity = (size_type)pEVar7->_vptr_Entity;
          local_1f0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_1f0._M_string_length = plVar4[1];
        *plVar4 = (long)pEVar7;
        plVar4[1] = 0;
        *(undefined1 *)&pEVar7->_vptr_Entity = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f0);
      }
      puVar8 = (ulong *)(local_210 + 0x10);
      puVar10 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar10) {
        local_210._16_8_ = *puVar10;
        local_210._24_8_ = plVar4[3];
        local_210._0_8_ = puVar8;
      }
      else {
        local_210._16_8_ = *puVar10;
        local_210._0_8_ = (ulong *)*plVar4;
      }
      local_210._8_8_ = plVar4[1];
      *plVar4 = (long)puVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)(local_120 + 0x10),(string *)local_210);
      if ((ulong *)local_210._0_8_ != puVar8) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if (local_188 != &local_178) {
        operator_delete(local_188,local_178 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      pVVar14 = (ValidatorImpl *)local_210;
      Entity::id_abi_cxx11_
                ((string *)local_210,
                 (Entity *)
                 local_140.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity
                 ._vptr_Entity);
      addIdMapItem(pVVar14,(string *)local_210,(string *)(local_120 + 0x10),local_148);
      if ((ulong *)local_210._0_8_ != puVar8) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
    }
    uVar12 = 0;
    while( true ) {
      sVar5 = Units::unitCount((Units *)local_140.super_ComponentEntity.super_NamedEntity.
                                        super_ParentedEntity.super_Entity._vptr_Entity);
      if (sVar5 <= uVar12) break;
      local_210._0_8_ = local_210 + 0x10;
      local_210._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_210._16_8_ = local_210._16_8_ & 0xffffffffffffff00;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      local_1f0._M_string_length = 0;
      local_1f0.field_2._M_allocated_capacity =
           local_1f0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      local_1d0._M_string_length = 0;
      local_1d0.field_2._M_allocated_capacity =
           local_1d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      Units::unitAttributes
                ((Units *)local_140.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                          super_Entity._vptr_Entity,uVar12,(string *)local_210,&local_1f0,&local_68,
                 &local_70,&local_1d0);
      if ((pointer)local_1d0._M_string_length != (pointer)0x0) {
        NamedEntity::name_abi_cxx11_
                  ((string *)local_b0,
                   (NamedEntity *)
                   local_140.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                   super_Entity._vptr_Entity);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x2b72c5);
        peVar11 = (element_type *)(plVar4 + 2);
        if ((element_type *)*plVar4 == peVar11) {
          local_120._0_8_ =
               (peVar11->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
               _vptr_Entity;
          local_120._8_8_ = plVar4[3];
          local_140.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
          super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_120;
        }
        else {
          local_120._0_8_ =
               (peVar11->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
               _vptr_Entity;
          local_140.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
          super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar4;
        }
        local_140.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
        super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
        *plVar4 = (long)peVar11;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append
                                   ((char *)&local_140.
                                             super_enable_shared_from_this<libcellml::Model>);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        puVar10 = (ulong *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar10) {
          local_1a8.field_2._M_allocated_capacity = *puVar10;
          local_1a8.field_2._8_8_ = plVar4[3];
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *puVar10;
          local_1a8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_1a8._M_string_length = plVar4[1];
        *plVar4 = (long)puVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        NamedEntity::name_abi_cxx11_
                  (&local_f0,
                   (NamedEntity *)
                   ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                   &local_1b0->super_Logger)->_M_ptr);
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          uVar13 = local_1a8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_f0._M_string_length + local_1a8._M_string_length) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            uVar13 = local_f0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_f0._M_string_length + local_1a8._M_string_length)
          goto LAB_00289444;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_f0,0,(char *)0x0,(ulong)local_1a8._M_dataplus._M_p);
        }
        else {
LAB_00289444:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1a8,(ulong)local_f0._M_dataplus._M_p);
        }
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        psVar2 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar2) {
          local_168.field_2._M_allocated_capacity = *psVar2;
          local_168.field_2._8_8_ = puVar6[3];
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar2;
          local_168._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_168._M_string_length = puVar6[1];
        *puVar6 = psVar2;
        puVar6[1] = 0;
        *(undefined1 *)psVar2 = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
        plVar4 = puVar6 + 2;
        if ((long *)*puVar6 == plVar4) {
          local_178 = *plVar4;
          lStack_170 = puVar6[3];
          local_188 = &local_178;
        }
        else {
          local_178 = *plVar4;
          local_188 = (long *)*puVar6;
        }
        local_180 = puVar6[1];
        *puVar6 = plVar4;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)(local_120 + 0x10),(string *)&local_188);
        if (local_188 != &local_178) {
          operator_delete(local_188,local_178 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if (local_140.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
            super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_120) {
          operator_delete(local_140.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
                          super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          local_120._0_8_ + 1);
        }
        pVVar14 = (ValidatorImpl *)local_b0._0_8_;
        if ((ValidatorImpl *)local_b0._0_8_ != (ValidatorImpl *)(local_b0 + 0x10)) {
          operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
        }
        addIdMapItem(pVVar14,&local_1d0,(string *)(local_120 + 0x10),local_148);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      uVar12 = uVar12 + 1;
    }
    ImportedEntity::importSource
              ((ImportedEntity *)
               ((long)local_140.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                      super_Entity._vptr_Entity + 0x10));
    if ((ulong *)local_210._0_8_ == (ulong *)0x0) {
      bVar3 = false;
    }
    else {
      ImportedEntity::importSource
                ((ImportedEntity *)
                 ((long)local_140.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                        super_Entity._vptr_Entity + 0x10));
      Entity::id_abi_cxx11_(&local_90,local_c0);
      bVar3 = local_90._M_string_length != 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
    }
    puVar10 = (ulong *)(local_210 + 0x10);
    if (bVar3) {
      NamedEntity::name_abi_cxx11_
                (&local_1d0,
                 (NamedEntity *)
                 local_140.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity
                 ._vptr_Entity);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x2b72d8);
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      pEVar7 = (Entity *)(plVar4 + 2);
      if ((Entity *)*plVar4 == pEVar7) {
        local_1f0.field_2._M_allocated_capacity = (size_type)pEVar7->_vptr_Entity;
        local_1f0.field_2._8_8_ = plVar4[3];
      }
      else {
        local_1f0.field_2._M_allocated_capacity = (size_type)pEVar7->_vptr_Entity;
        local_1f0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_1f0._M_string_length = plVar4[1];
      *plVar4 = (long)pEVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f0);
      puVar8 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar8) {
        local_210._16_8_ = *puVar8;
        local_210._24_8_ = plVar4[3];
        local_210._0_8_ = puVar10;
      }
      else {
        local_210._16_8_ = *puVar8;
        local_210._0_8_ = (ulong *)*plVar4;
      }
      local_210._8_8_ = plVar4[1];
      *plVar4 = (long)puVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)(local_120 + 0x10),(string *)local_210);
      if ((ulong *)local_210._0_8_ != puVar10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      ImportedEntity::importSource
                ((ImportedEntity *)
                 ((long)local_140.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.
                        super_Entity._vptr_Entity + 0x10));
      pVVar14 = (ValidatorImpl *)local_210;
      Entity::id_abi_cxx11_((string *)local_210,(Entity *)local_1f0._M_dataplus._M_p);
      addIdMapItem(pVVar14,(string *)local_210,(string *)(local_120 + 0x10),local_148);
      if ((ulong *)local_210._0_8_ != puVar10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._M_string_length);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_140.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_140.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity
                 .mPimpl);
    }
    local_d0 = local_d0 + 1;
  }
  ComponentEntity::encapsulationId_abi_cxx11_
            ((string *)local_210,
             &((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
              &local_1b0->super_Logger)->_M_ptr->super_ComponentEntity);
  pVVar14 = local_c8;
  uVar13 = local_210._8_8_;
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar13 ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00289e13;
  ComponentEntity::encapsulationId_abi_cxx11_
            ((string *)local_210,
             &((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
              &local_1b0->super_Logger)->_M_ptr->super_ComponentEntity);
  bVar3 = isValidXmlName((string *)local_210);
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if (!bVar3) {
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((IssueImpl *)
               ((local_140.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
                 super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl,
               XML_ID_ATTRIBUTE);
    AnyCellmlElement::AnyCellmlElementImpl::setModel
              (*(AnyCellmlElementImpl **)
                ((local_140.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
                  super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl[1]
                .mId._M_string_length,(ModelPtr *)local_1b0,MODEL);
    this_00 = (IssueImpl *)
              ((local_140.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
                super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
    NamedEntity::name_abi_cxx11_
              (&local_168,
               (NamedEntity *)
               ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
               &local_1b0->super_Logger)->_M_ptr);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x2b4469);
    local_188 = &local_178;
    plVar4 = puVar6 + 2;
    if ((long *)*puVar6 == plVar4) {
      local_178 = *plVar4;
      lStack_170 = puVar6[3];
    }
    else {
      local_178 = *plVar4;
      local_188 = (long *)*puVar6;
    }
    local_180 = puVar6[1];
    *puVar6 = plVar4;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    puVar10 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_1d0.field_2._M_allocated_capacity = *puVar10;
      local_1d0.field_2._8_8_ = puVar6[3];
    }
    else {
      local_1d0.field_2._M_allocated_capacity = *puVar10;
      local_1d0._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1d0._M_string_length = puVar6[1];
    *puVar6 = puVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    ComponentEntity::encapsulationId_abi_cxx11_
              (&local_1a8,
               &((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                &local_1b0->super_Logger)->_M_ptr->super_ComponentEntity);
    uVar12 = (long)&((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2> *)
                    local_1d0._M_string_length)->_M_ptr + local_1a8._M_string_length;
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      uVar13 = local_1d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < uVar12) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        uVar13 = local_1a8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < uVar12) goto LAB_00289b01;
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_1a8,0,(char *)0x0,(ulong)local_1d0._M_dataplus._M_p)
      ;
    }
    else {
LAB_00289b01:
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1d0,(ulong)local_1a8._M_dataplus._M_p);
    }
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    pEVar7 = (Entity *)(plVar4 + 2);
    if ((Entity *)*plVar4 == pEVar7) {
      local_1f0.field_2._M_allocated_capacity = (size_type)pEVar7->_vptr_Entity;
      local_1f0.field_2._8_8_ = plVar4[3];
    }
    else {
      local_1f0.field_2._M_allocated_capacity = (size_type)pEVar7->_vptr_Entity;
      local_1f0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1f0._M_string_length = plVar4[1];
    *plVar4 = (long)pEVar7;
    plVar4[1] = 0;
    *(undefined1 *)&pEVar7->_vptr_Entity = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    local_210._0_8_ = local_210 + 0x10;
    puVar10 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar10) {
      local_210._16_8_ = *puVar10;
      local_210._24_8_ = plVar4[3];
    }
    else {
      local_210._16_8_ = *puVar10;
      local_210._0_8_ = (ulong *)*plVar4;
    }
    local_210._8_8_ = plVar4[1];
    *plVar4 = (long)puVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Issue::IssueImpl::setDescription(this_00,(string *)local_210);
    if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if (local_188 != &local_178) {
      operator_delete(local_188,local_178 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    Logger::LoggerImpl::addIssue
              (&pVVar14->super_LoggerImpl,
               (IssuePtr *)&local_140.super_enable_shared_from_this<libcellml::Model>);
    if (local_140.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
        super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_140.super_enable_shared_from_this<libcellml::Model>._M_weak_this.
                 super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  puVar10 = (ulong *)(local_210 + 0x10);
  NamedEntity::name_abi_cxx11_
            (&local_1d0,
             (NamedEntity *)
             ((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&local_1b0->super_Logger
             )->_M_ptr);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x2b732d);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  pEVar7 = (Entity *)(plVar4 + 2);
  if ((Entity *)*plVar4 == pEVar7) {
    local_1f0.field_2._M_allocated_capacity = (size_type)pEVar7->_vptr_Entity;
    local_1f0.field_2._8_8_ = plVar4[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = (size_type)pEVar7->_vptr_Entity;
    local_1f0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_1f0._M_string_length = plVar4[1];
  *plVar4 = (long)pEVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  puVar8 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar8) {
    local_210._16_8_ = *puVar8;
    local_210._24_8_ = plVar4[3];
    local_210._0_8_ = puVar10;
  }
  else {
    local_210._16_8_ = *puVar8;
    local_210._0_8_ = (ulong *)*plVar4;
  }
  local_210._8_8_ = plVar4[1];
  *plVar4 = (long)puVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)(local_120 + 0x10),(string *)local_210);
  if ((ulong *)local_210._0_8_ != puVar10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  this_01 = (ValidatorImpl *)local_210;
  ComponentEntity::encapsulationId_abi_cxx11_
            ((string *)this_01,
             &((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
              &local_1b0->super_Logger)->_M_ptr->super_ComponentEntity);
  addIdMapItem(this_01,(string *)local_210,(string *)(local_120 + 0x10),local_148);
  if ((ulong *)local_210._0_8_ != puVar10) {
    operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
  }
LAB_00289e13:
  for (uVar12 = 0;
      sVar5 = ComponentEntity::componentCount
                        (&((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                          &local_1b0->super_Logger)->_M_ptr->super_ComponentEntity), uVar12 < sVar5;
      uVar12 = uVar12 + 1) {
    ComponentEntity::component
              ((ComponentEntity *)local_210,
               (size_t)((__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
                       &local_1b0->super_Logger)->_M_ptr);
    buildComponentIdMap(pVVar14,(ComponentPtr *)local_210,local_148,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_60);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((element_type *)local_110._0_8_ != (element_type *)(local_110 + 0x10)) {
    operator_delete((void *)local_110._0_8_,CONCAT71(uStack_ff,local_110[0x10]) + 1);
  }
  return local_148;
}

Assistant:

IdMap Validator::ValidatorImpl::buildModelIdMap(const ModelPtr &model)
{
    IdMap idMap;
    std::string info;
    std::set<std::string> reportedConnections;
    // Model.
    if (!model->id().empty()) {
        info = " - model '" + model->name() + "'";
        addIdMapItem(model->id(), info, idMap);
    }

    // Units.
    for (size_t u = 0; u < model->unitsCount(); ++u) {
        auto units = model->units(u);
        if (!units->id().empty()) {
            if (units->isImport()) {
                info = " - imported units '" + units->name() + "' in model '" + model->name() + "'";
            } else {
                info = " - units '" + units->name() + "' in model '" + model->name() + "'";
            }
            addIdMapItem(units->id(), info, idMap);
        }
        for (size_t i = 0; i < units->unitCount(); ++i) {
            std::string reference;
            std::string prefix;
            double exponent;
            double multiplier;
            std::string id;
            units->unitAttributes(i, reference, prefix, exponent, multiplier, id);
            if (!id.empty()) {
                info = " - unit in units '" + units->name() + "' in model '" + model->name() + "'";
                addIdMapItem(id, info, idMap);
            }
        }
        if ((units->importSource() != nullptr) && !units->importSource()->id().empty()) {
            info = " - import source for units '" + units->name() + "'";
            addIdMapItem(units->importSource()->id(), info, idMap);
        }
    }
    // Encapsulation.
    if (!model->encapsulationId().empty()) {
        // Check for a valid identifier.
        if (!isValidXmlName(model->encapsulationId())) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
            issue->mPimpl->mItem->mPimpl->setModel(model);
            issue->mPimpl->setDescription("Model '" + model->name() + "' does not have a valid encapsulation 'id' attribute, '" + model->encapsulationId() + "'.");
            addIssue(issue);
        }

        info = " - encapsulation in model '" + model->name() + "'";
        addIdMapItem(model->encapsulationId(), info, idMap);
    }

    // Start recursion through encapsulation hierarchy.
    for (size_t c = 0; c < model->componentCount(); ++c) {
        buildComponentIdMap(model->component(c), idMap, reportedConnections);
    }
    return idMap;
}